

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_add1_bf16_bf16(ggml_compute_params *params,ggml_tensor *dst)

{
  ushort uVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  void *pvVar13;
  void *pvVar14;
  float fVar15;
  char cVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  ushort uVar24;
  undefined8 uVar25;
  long lVar26;
  long lVar27;
  anon_union_4_2_947300a4 u;
  
  pgVar3 = dst->src[0];
  pgVar4 = dst->src[1];
  cVar16 = ggml_are_same_shape(pgVar3);
  if (cVar16 == '\0') {
    pcVar22 = "ggml_are_same_shape(src0, dst)";
    uVar25 = 0x648;
  }
  else {
    cVar16 = ggml_is_scalar(pgVar4);
    if (cVar16 == '\0') {
      pcVar22 = "ggml_is_scalar(src1)";
      uVar25 = 0x649;
    }
    else {
      uVar1 = *pgVar4->data;
      iVar2 = params->ith;
      iVar18 = params->nth;
      iVar17 = ggml_nrows(pgVar3);
      if (pgVar3->type == GGML_TYPE_BF16) {
        if (pgVar4->type == GGML_TYPE_BF16) {
          if (dst->type == GGML_TYPE_BF16) {
            if (dst->nb[0] == 2) {
              if (pgVar3->nb[0] == 2) {
                iVar18 = (iVar18 + -1 + iVar17) / iVar18;
                lVar23 = (long)iVar2 * (long)iVar18;
                iVar18 = iVar18 + (int)lVar23;
                if (iVar17 <= iVar18) {
                  iVar18 = iVar17;
                }
                if ((int)lVar23 < iVar18) {
                  sVar5 = pgVar3->nb[1];
                  sVar6 = pgVar3->nb[2];
                  sVar7 = pgVar3->nb[3];
                  lVar8 = dst->ne[0];
                  lVar9 = dst->ne[1];
                  sVar10 = dst->nb[1];
                  sVar11 = dst->nb[2];
                  sVar12 = dst->nb[3];
                  lVar27 = dst->ne[2] * lVar9;
                  pvVar13 = dst->data;
                  pvVar14 = pgVar3->data;
                  do {
                    lVar20 = (long)(int)(lVar23 / lVar27);
                    lVar19 = lVar23 - lVar27 * lVar20;
                    if (0 < lVar8) {
                      lVar26 = (long)(int)(lVar19 / lVar9);
                      lVar19 = (long)(int)(lVar19 % lVar9);
                      lVar21 = 0;
                      do {
                        fVar15 = (float)((uint)uVar1 << 0x10) +
                                 (float)((uint)*(ushort *)
                                                ((long)pvVar14 +
                                                lVar21 * 2 +
                                                lVar26 * sVar6 + lVar19 * sVar5 + lVar20 * sVar7) <<
                                        0x10);
                        if ((uint)ABS(fVar15) < 0x7f800001) {
                          uVar24 = (ushort)((int)fVar15 + 0x7fff + ((uint)fVar15 >> 0x10 & 1) >>
                                           0x10);
                        }
                        else {
                          uVar24 = (ushort)((uint)fVar15 >> 0x10) | 0x40;
                        }
                        *(ushort *)
                         ((long)pvVar13 +
                         lVar21 * 2 + lVar26 * sVar11 + lVar19 * sVar10 + lVar20 * sVar12) = uVar24;
                        lVar21 = lVar21 + 1;
                      } while (lVar8 != lVar21);
                    }
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != iVar18);
                }
                return;
              }
              pcVar22 = "nb00 == sizeof(ggml_bf16_t)";
              uVar25 = 0x65a;
            }
            else {
              pcVar22 = "nb0 == sizeof(ggml_bf16_t)";
              uVar25 = 0x659;
            }
          }
          else {
            pcVar22 = "dst->type == GGML_TYPE_BF16";
            uVar25 = 0x657;
          }
        }
        else {
          pcVar22 = "src1->type == GGML_TYPE_BF16";
          uVar25 = 0x656;
        }
      }
      else {
        pcVar22 = "src0->type == GGML_TYPE_BF16";
        uVar25 = 0x655;
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar22);
}

Assistant:

static void ggml_compute_forward_add1_bf16_bf16(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];

    GGML_ASSERT(ggml_are_same_shape(src0, dst));
    GGML_ASSERT(ggml_is_scalar(src1));

    // scalar to add
    const float v = GGML_BF16_TO_FP32(*(ggml_bf16_t *) src1->data);

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr  = ggml_nrows(src0);

    GGML_TENSOR_UNARY_OP_LOCALS

    GGML_ASSERT(src0->type == GGML_TYPE_BF16);
    GGML_ASSERT(src1->type == GGML_TYPE_BF16);
    GGML_ASSERT(dst->type  == GGML_TYPE_BF16);

    GGML_ASSERT( nb0 == sizeof(ggml_bf16_t));
    GGML_ASSERT(nb00 == sizeof(ggml_bf16_t));

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    for (int ir = ir0; ir < ir1; ++ir) {
        // src0 and dst are same shape => same indices
        const int i3 = ir/(ne2*ne1);
        const int i2 = (ir - i3*ne2*ne1)/ne1;
        const int i1 = (ir - i3*ne2*ne1 - i2*ne1);

        ggml_bf16_t * dst_ptr  = (ggml_bf16_t *) ((char *) dst->data  + i3*nb3  + i2*nb2  + i1*nb1 );
        ggml_bf16_t * src0_ptr = (ggml_bf16_t *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01);
        for (int i = 0; i < ne0; i++) {
            dst_ptr[i] = GGML_FP32_TO_BF16(GGML_BF16_TO_FP32(src0_ptr[i]) + v);
        }
    }
}